

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O2

void recvCompleteCallback
               (void *context,CONTROL_PACKET_TYPE packet,int flags,BUFFER_HANDLE headerData)

{
  byte *pbVar1;
  MQTT_CLIENT_EVENT_ERROR error_type;
  long lVar2;
  uint8_t *puVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  STRING_HANDLE pSVar7;
  QOS_VALUE *pQVar8;
  BUFFER_HANDLE handle;
  uchar *data;
  char *pcVar9;
  MQTT_MESSAGE_HANDLE handle_00;
  undefined8 uVar10;
  QOS_VALUE QVar11;
  SUBSCRIBE_ACK *pSVar12;
  byte bVar13;
  size_t sVar14;
  undefined8 uVar15;
  char *pcVar16;
  ulong __n;
  uint8_t *iterator;
  QOS_VALUE local_6c;
  SUBSCRIBE_ACK suback;
  STRING_HANDLE local_48;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
               ,"recvCompleteCallback",0x3f1,1,"recvCompleteCallback context failed.");
    return;
  }
  iterator = (uint8_t *)0x0;
  if (headerData == (BUFFER_HANDLE)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = BUFFER_length(headerData);
    iterator = BUFFER_u_char(headerData);
  }
  puVar3 = iterator;
  if ((packet != PINGRESP_TYPE) && (iterator == (uint8_t *)0x0 || sVar6 == 0)) {
    return;
  }
  switch(packet << 0x1c | (uint)(packet + 0xffffffe0) >> 4) {
  case PACKET_INVALID1_TYPE:
    suback.packetId = 0;
    suback._2_6_ = 0;
    if (sVar6 == 2) {
      bVar13 = *iterator;
      if (bVar13 < 2) {
        pbVar1 = iterator + 1;
        iterator = iterator + 2;
        suback._4_1_ = 6;
        if (*pbVar1 < 6) {
          suback._4_1_ = *pbVar1;
        }
        suback._1_3_ = 0;
        suback.packetId._0_1_ = bVar13 == 1;
        suback._5_3_ = 0;
        if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
          pcVar16 = "false";
          if (bVar13 == 1) {
            pcVar16 = "true";
          }
          pSVar7 = STRING_construct_sprintf
                             ("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x",pcVar16);
          log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
          STRING_delete(pSVar7);
        }
        (**(code **)((long)context + 0x28))(context,1,&suback,*(undefined8 *)((long)context + 0x38))
        ;
        if (suback._4_4_ != 0) {
          return;
        }
        *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 1;
        return;
      }
      iterator = iterator + 1;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Invalid CONNACK packet.";
        iVar5 = 0x32b;
LAB_0015eead:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                   ,"recvCompleteCallback",iVar5,1,pcVar16);
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Invalid CONNACK packet.";
        iVar5 = 0x323;
        goto LAB_0015eead;
      }
    }
    break;
  case 1:
    local_6c = (uint)((flags & 2U) == 0) + DELIVER_AT_LEAST_ONCE;
    if (flags == 0) {
      local_6c = DELIVER_AT_MOST_ONCE;
    }
    suback._0_8_ = iterator;
    uVar4 = byteutil_read_uint16((uint8_t **)&suback,sVar6);
    uVar10 = suback._0_8_;
    if ((uVar4 == 0) || (__n = (ulong)uVar4, sVar6 < (__n - (long)puVar3) + suback._0_8_)) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "String passed not a valid UTF.";
        iVar5 = 0xbd;
LAB_0015f090:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                   ,"byteutil_readUTF",iVar5,1,pcVar16);
      }
    }
    else {
      pQVar8 = (QOS_VALUE *)malloc(__n + 1);
      if (pQVar8 != (QOS_VALUE *)0x0) {
        memcpy(pQVar8,(void *)uVar10,__n);
        *(char *)((long)pQVar8 + __n) = '\0';
        suback._0_8_ = uVar10 + __n;
        if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
          local_48 = (STRING_HANDLE)0x0;
        }
        else {
          pcVar16 = "false";
          if ((flags & 8U) != 0) {
            pcVar16 = "true";
          }
          pcVar9 = MU_QOS_VALUE_ToString(local_6c);
          local_48 = STRING_construct_sprintf
                               ("PUBLISH | IS_DUP: %s | RETAIN: %d | QOS: %s | TOPIC_NAME: %s",
                                pcVar16,(ulong)(flags & 1U),pcVar9,pQVar8);
        }
        if (flags == 0) {
          uVar4 = 0;
LAB_0015f60d:
          lVar2 = sVar6 - suback._0_8_;
          handle_00 = mqttmessage_create_in_place
                                (uVar4,(char *)pQVar8,local_6c,(uint8_t *)suback._0_8_,
                                 (size_t)(puVar3 + lVar2));
          if (handle_00 == (MQTT_MESSAGE_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                         ,"ProcessPublishMessage",0x2e4,1,"failure in mqttmessage_create");
            }
            set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_MEMORY_ERROR);
          }
          else {
            iVar5 = mqttmessage_setIsDuplicateMsg(handle_00,SUB41((flags & 8U) >> 3,0));
            if ((iVar5 == 0) &&
               (iVar5 = mqttmessage_setIsRetained(handle_00,SUB41(flags & 1U,0)), iVar5 == 0)) {
              if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
                STRING_sprintf(local_48," | PAYLOAD_LEN: %lu",puVar3 + lVar2);
                log_incoming_trace((MQTT_CLIENT *)context,local_48);
              }
              iVar5 = (**(code **)((long)context + 0x30))
                                (handle_00,*(undefined8 *)((long)context + 0x38));
              if (iVar5 == 1) {
                SendMessageAck((MQTT_CLIENT *)context,uVar4,local_6c);
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                           ,"ProcessPublishMessage",0x2ea,1,"failure setting mqtt message property")
                ;
              }
              set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_MEMORY_ERROR);
            }
          }
          mqttmessage_destroy(handle_00);
        }
        else {
          uVar4 = byteutil_read_uint16
                            ((uint8_t **)&suback,(size_t)(puVar3 + (sVar6 - suback._0_8_)));
          if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
            STRING_sprintf(local_48," | PACKET_ID: %u",(ulong)uVar4);
          }
          if (uVar4 != 0) goto LAB_0015f60d;
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                       ,"ProcessPublishMessage",0x2da,1,"Publish MSG: packetId=0, invalid");
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_PARSE_ERROR);
        }
        if (local_48 != (STRING_HANDLE)0x0) {
          STRING_delete(local_48);
        }
LAB_0015f743:
        free(pQVar8);
        return;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar16 = "Cannot alloc memory, size:%zu";
        iVar5 = 0xb8;
        goto LAB_0015f090;
      }
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                 ,"ProcessPublishMessage",0x2be,1,"Publish MSG: failure reading topic name");
    }
    error_type = MQTT_CLIENT_PARSE_ERROR;
    goto LAB_0015f476;
  case 2:
  case 3:
  case 4:
  case 5:
    if (sVar6 == 2) {
      if (packet == PUBACK_TYPE) {
        bVar13 = 2;
      }
      else if (packet == PUBREC_TYPE) {
        bVar13 = 3;
      }
      else {
        bVar13 = packet == PUBREL_TYPE ^ 5;
      }
      uVar4 = byteutil_read_uint16(&iterator,2);
      suback.packetId = uVar4;
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        if (packet == PUBACK_TYPE) {
          pcVar16 = "PUBACK";
        }
        else if (packet == PUBREC_TYPE) {
          pcVar16 = "PUBREC";
        }
        else {
          pcVar16 = "PUBCOMP";
          if (packet == PUBREL_TYPE) {
            pcVar16 = "PUBREL";
          }
        }
        pSVar7 = STRING_construct_sprintf("%s | PACKET_ID: %u",pcVar16,(ulong)uVar4);
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      (**(code **)((long)context + 0x28))
                (context,bVar13,&suback,*(undefined8 *)((long)context + 0x38));
      if (packet == PUBREL_TYPE) {
        handle = mqtt_codec_publishComplete(suback.packetId);
        if (handle != (BUFFER_HANDLE)0x0) goto LAB_0015f3d3;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar16 = "Failed to allocate publish complete message.";
          iVar5 = 0x379;
          goto LAB_0015f46f;
        }
      }
      else {
        if (packet != PUBREC_TYPE) {
          return;
        }
        handle = mqtt_codec_publishRelease(suback.packetId);
        if (handle != (BUFFER_HANDLE)0x0) {
LAB_0015f3d3:
          sVar6 = BUFFER_length(handle);
          data = BUFFER_u_char(handle);
          iVar5 = sendPacketItem((MQTT_CLIENT *)context,data,sVar6);
          if (iVar5 != 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                         ,"recvCompleteCallback",0x382,1,"Failed sending publish reply.");
            }
            set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
          }
          BUFFER_delete(handle);
          return;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar16 = "Failed to allocate publish release message.";
          iVar5 = 0x370;
LAB_0015f46f:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                     ,"recvCompleteCallback",iVar5,1,pcVar16);
        }
      }
      goto LAB_0015f474;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid packet length.";
      iVar5 = 0x352;
      goto LAB_0015eead;
    }
    break;
  default:
    goto switchD_0015ee6e_caseD_6;
  case 7:
    suback.packetId = 0;
    suback._2_6_ = 0;
    suback.qosReturn = (QOS_VALUE *)0x0;
    suback.qosCount = 0;
    uVar4 = byteutil_read_uint16(&iterator,sVar6);
    suback.packetId = uVar4;
    if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
      pSVar7 = (STRING_HANDLE)0x0;
    }
    else {
      pSVar7 = STRING_construct_sprintf("SUBACK | PACKET_ID: %u",(ulong)uVar4);
    }
    if ((sVar6 - 2 >> 0x3e == 0) &&
       (pQVar8 = (QOS_VALUE *)malloc((sVar6 - 2) * 4), suback.qosReturn = pQVar8,
       pQVar8 != (QOS_VALUE *)0x0)) {
      for (sVar14 = 1; (2 - sVar6) + sVar14 != 1; sVar14 = sVar14 + 1) {
        bVar13 = *iterator;
        QVar11 = (QOS_VALUE)bVar13;
        iterator = iterator + 1;
        if ((bVar13 & 0x7c) != 0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                       ,"recvCompleteCallback",0x3a4,1,"Invalid SUBACK_TYPE packet.");
          }
          set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_COMMUNICATION_ERROR);
          break;
        }
        if (2 < bVar13) {
          QVar11 = DELIVER_FAILURE;
        }
        pQVar8[sVar14 - 1] = QVar11;
        suback.qosCount = sVar14;
        if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
          STRING_sprintf(pSVar7," | RETURN_CODE: %u");
        }
      }
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      (**(code **)((long)context + 0x28))(context,6,&suback,*(undefined8 *)((long)context + 0x38));
      pQVar8 = suback.qosReturn;
      goto LAB_0015f743;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "allocation of quality of service value failed, size:%zu";
      iVar5 = 0x3c0;
      goto LAB_0015f46f;
    }
LAB_0015f474:
    error_type = MQTT_CLIENT_MEMORY_ERROR;
    goto LAB_0015f476;
  case 9:
    if (sVar6 == 2) {
      uVar4 = byteutil_read_uint16(&iterator,2);
      suback.packetId = uVar4;
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        pSVar7 = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %u",(ulong)uVar4);
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      uVar10 = *(undefined8 *)((long)context + 0x38);
      uVar15 = 7;
      pSVar12 = &suback;
      goto LAB_0015f10f;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid UNSUBACK packet length.";
      iVar5 = 0x3cb;
      goto LAB_0015eead;
    }
    break;
  case 0xb:
    *(undefined8 *)((long)context + 0xa8) = 0;
    if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
      pSVar7 = STRING_construct_sprintf("PINGRESP");
      log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
      STRING_delete(pSVar7);
    }
    uVar10 = *(undefined8 *)((long)context + 0x38);
    uVar15 = 8;
    pSVar12 = (SUBSCRIBE_ACK *)0x0;
LAB_0015f10f:
    (**(code **)((long)context + 0x28))(context,uVar15,pSVar12,uVar10);
    goto switchD_0015ee6e_caseD_6;
  }
  error_type = MQTT_CLIENT_COMMUNICATION_ERROR;
LAB_0015f476:
  set_error_callback((MQTT_CLIENT *)context,error_type);
switchD_0015ee6e_caseD_6:
  return;
}

Assistant:

static void recvCompleteCallback(void* context, CONTROL_PACKET_TYPE packet, int flags, BUFFER_HANDLE headerData)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        size_t packetLength = 0;
        uint8_t* iterator = NULL;
        if (headerData != NULL)
        {
            packetLength = BUFFER_length(headerData);
            iterator = BUFFER_u_char(headerData);
        }

#ifdef ENABLE_RAW_TRACE
        logIncomingRawTrace(mqtt_client, packet, (uint8_t)flags, iterator, packetLength);
#endif
        if ((iterator != NULL && packetLength > 0) || packet == PINGRESP_TYPE)
        {
            switch (packet)
            {
                case CONNACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_028: [If the actionResult parameter is of type CONNECT_ACK then the msgInfo value shall be a CONNECT_ACK structure.]*/
                    CONNECT_ACK connack = { 0 };
                    if (packetLength != 2) // CONNACK payload must be only 2 bytes
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    uint8_t connect_acknowledge_flags = byteutil_readByte(&iterator);
                    if (connect_acknowledge_flags & 0xFE) // bits 7-1 must be zero
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    connack.isSessionPresent = (connect_acknowledge_flags == 0x1) ? true : false;
                    uint8_t rc = byteutil_readByte(&iterator);
                    connack.returnCode =
                        (rc < ((uint8_t)CONN_REFUSED_UNKNOWN)) ?
                        (CONNECT_RETURN_CODE)rc : CONN_REFUSED_UNKNOWN;

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x", connack.isSessionPresent ? TRUE_CONST : FALSE_CONST, connack.returnCode);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_CONNACK, (void*)&connack, mqtt_client->ctx);

                    if (connack.returnCode == CONNECTION_ACCEPTED)
                    {
                        mqtt_client->mqtt_status |= MQTT_STATUS_CLIENT_CONNECTED;
                    }
                    break;
                }
                case PUBLISH_TYPE:
                {
                    ProcessPublishMessage(mqtt_client, iterator, packetLength, flags);
                    break;
                }
                case PUBACK_TYPE:
                case PUBREC_TYPE:
                case PUBREL_TYPE:
                case PUBCOMP_TYPE:
                {
                    if (packetLength != 2) // PUBXXX payload must be only 2 bytes
                    {
                        LogError("Invalid packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    /*Codes_SRS_MQTT_CLIENT_07_029: [If the actionResult parameter are of types PUBACK_TYPE, PUBREC_TYPE, PUBREL_TYPE or PUBCOMP_TYPE then the msgInfo value shall be a PUBLISH_ACK structure.]*/
                    MQTT_CLIENT_EVENT_RESULT action = (packet == PUBACK_TYPE) ? MQTT_CLIENT_ON_PUBLISH_ACK :
                        (packet == PUBREC_TYPE) ? MQTT_CLIENT_ON_PUBLISH_RECV :
                        (packet == PUBREL_TYPE) ? MQTT_CLIENT_ON_PUBLISH_REL : MQTT_CLIENT_ON_PUBLISH_COMP;

                    PUBLISH_ACK publish_ack = { 0 };
                    publish_ack.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, packet == PUBACK_TYPE ? "PUBACK" : (packet == PUBREC_TYPE) ? "PUBREC" : (packet == PUBREL_TYPE) ? "PUBREL" : "PUBCOMP",
                            publish_ack.packetId);

                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    BUFFER_HANDLE pubRel = NULL;
                    mqtt_client->fnOperationCallback(mqtt_client, action, (void*)&publish_ack, mqtt_client->ctx);
                    if (packet == PUBREC_TYPE)
                    {
                        pubRel = mqtt_codec_publishRelease(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish release message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    else if (packet == PUBREL_TYPE)
                    {
                        pubRel = mqtt_codec_publishComplete(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish complete message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    if (pubRel != NULL)
                    {
                        size_t size = BUFFER_length(pubRel);
                        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
                        {
                            LogError("Failed sending publish reply.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        }
                        BUFFER_delete(pubRel);
                    }
                    break;
                }
                case SUBACK_TYPE:
                {

                    /*Codes_SRS_MQTT_CLIENT_07_030: [If the actionResult parameter is of type SUBACK_TYPE then the msgInfo value shall be a SUBSCRIBE_ACK structure.]*/
                    SUBSCRIBE_ACK suback = { 0 };

                    size_t remainLen = packetLength;
                    suback.packetId = byteutil_read_uint16(&iterator, packetLength);
                    remainLen -= 2;

#ifndef NO_LOGGING
                    STRING_HANDLE trace_log = NULL;
                    if (is_trace_enabled(mqtt_client))
                    {
                        trace_log = STRING_construct_sprintf("SUBACK | PACKET_ID: %"PRIu16, suback.packetId);
                    }
#endif
                    // Allocate the remaining len
                    size_t malloc_size = safe_multiply_size_t(sizeof(QOS_VALUE), remainLen);
                    if (malloc_size != SIZE_MAX && 
                        (suback.qosReturn = (QOS_VALUE*)malloc(malloc_size)) != NULL)
                    {
                        while (remainLen > 0)
                        {
                            uint8_t qosRet = byteutil_readByte(&iterator);
                            if (qosRet & 0x7C) // SUBACK QOS bits 6-2 must be zero
                            {
                                LogError("Invalid SUBACK_TYPE packet.");
                                set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                                break;
                            }
                            suback.qosReturn[suback.qosCount++] =
                                (qosRet <= ((uint8_t)DELIVER_EXACTLY_ONCE)) ?
                                (QOS_VALUE)qosRet :  DELIVER_FAILURE;
                            remainLen--;
#ifndef NO_LOGGING
                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_sprintf(trace_log, " | RETURN_CODE: %"PRIu16, suback.qosReturn[suback.qosCount-1]);
                            }
#endif
                        }

#ifndef NO_LOGGING
                        if (is_trace_enabled(mqtt_client))
                        {
                            log_incoming_trace(mqtt_client, trace_log);
                            STRING_delete(trace_log);
                        }
#endif
                        mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_SUBSCRIBE_ACK, (void*)&suback, mqtt_client->ctx);
                        free(suback.qosReturn);
                    }
                    else
                    {
                        LogError("allocation of quality of service value failed, size:%zu", malloc_size);
                        set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                    }
                    break;
                }
                case UNSUBACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_031: [If the actionResult parameter is of type UNSUBACK_TYPE then the msgInfo value shall be a UNSUBSCRIBE_ACK structure.]*/
                    UNSUBSCRIBE_ACK unsuback = { 0 };
                    if (packetLength != 2) // UNSUBACK_TYPE payload must be only 2 bytes
                    {
                        LogError("Invalid UNSUBACK packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    unsuback.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %"PRIu16, unsuback.packetId);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_UNSUBSCRIBE_ACK, (void*)&unsuback, mqtt_client->ctx);
                    break;
                }
                case PINGRESP_TYPE:
                    mqtt_client->timeSincePing = 0;
#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("PINGRESP");
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    // Forward ping response to operation callback
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_PING_RESPONSE, NULL, mqtt_client->ctx);
                    break;
                default:
                    break;
            }
        }
    }
    else
    {
        LogError("recvCompleteCallback context failed.");
    }
}